

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O2

int __thiscall
CLayer::GetNetInOverFlowBoundary
          (CLayer *this,
          hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
          *pNetList)

{
  CBoundary *this_00;
  pointer ppCVar1;
  int iVar2;
  int *piVar3;
  _Rb_tree_node_base *p_Var4;
  pointer ppCVar5;
  vector<CNet_*,_std::allocator<CNet_*>_> NetList;
  CObject *local_60;
  CObject *local_58;
  CObject *local_50;
  _Vector_base<CNet_*,_std::allocator<CNet_*>_> local_48;
  
  for (p_Var4 = (this->m_CBoundaryBucket)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->m_CBoundaryBucket)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    this_00 = (CBoundary *)p_Var4[1]._M_parent;
    ppCVar1 = (this_00->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppCVar5 = (this_00->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppCVar5 != ppCVar1; ppCVar5 = ppCVar5 + 1) {
      iVar2 = CBoundary::GetCongestion(this_00);
      local_50 = ((*ppCVar5)->super_CObject).m_pParent;
      piVar3 = __gnu_cxx::
               hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
               ::operator[](pNetList,(key_type *)&local_50);
      if (*piVar3 < iVar2) {
        iVar2 = CBoundary::GetCongestion(this_00);
      }
      else {
        local_58 = ((*ppCVar5)->super_CObject).m_pParent;
        piVar3 = __gnu_cxx::
                 hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
                 ::operator[](pNetList,(key_type *)&local_58);
        iVar2 = *piVar3;
      }
      local_60 = ((*ppCVar5)->super_CObject).m_pParent;
      piVar3 = __gnu_cxx::
               hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
               ::operator[](pNetList,(key_type *)&local_60);
      *piVar3 = iVar2;
    }
    std::_Vector_base<CNet_*,_std::allocator<CNet_*>_>::~_Vector_base(&local_48);
  }
  return (int)(pNetList->_M_ht)._M_num_elements;
}

Assistant:

int CLayer::GetNetInOverFlowBoundary(hash_map<ADDRESS,int>* pNetList)
{
	for(multimap<int, CBoundary*>::iterator itr=m_CBoundaryBucket.begin(),end=m_CBoundaryBucket.end();itr!=end;++itr)
	{
		vector<CNet*>	NetList;
		CBoundary*	pBoundary	=	itr->second;

		for(vector<CWire*>::iterator itrw=pBoundary->m_Wire.begin(),end=pBoundary->m_Wire.end();itrw!=end;++itrw)
		{
			(*pNetList)[(ADDRESS)(*itrw)->GetParent()]	=	MAX(pBoundary->GetCongestion(),(*pNetList)[(ADDRESS)(*itrw)->GetParent()]);
		}
	}

	return	pNetList->size();
}